

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

bool __thiscall
crnlib::vector<unsigned_int>::operator==(vector<unsigned_int> *this,vector<unsigned_int> *rhs)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = this->m_size;
  if (uVar1 != rhs->m_size) {
    return false;
  }
  if ((ulong)uVar1 != 0) {
    iVar2 = bcmp(this->m_p,rhs->m_p,(ulong)uVar1 << 2);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

inline bool operator==(const vector& rhs) const
        {
            if (m_size != rhs.m_size)
            {
                return false;
            }
            else if (m_size)
            {
                if (scalar_type<T>::cFlag)
                {
                    return memcmp(m_p, rhs.m_p, sizeof(T) * m_size) == 0;
                }
                else
                {
                    const T* pSrc = m_p;
                    const T* pDst = rhs.m_p;
                    for (uint i = m_size; i; i--)
                    {
                        if (*pSrc++ != *pDst++)
                        {
                            return false;
                        }
                    }
                }
            }

            return true;
        }